

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmbeddedFunctions.cpp
# Opt level: O2

bool Refal2::embeddedCvd(CExecutionContext *executionContext)

{
  bool bVar1;
  string text;
  CArbitraryInteger number;
  string local_50;
  CArbitraryInteger local_30;
  
  CArbitraryInteger::CArbitraryInteger(&local_30);
  bVar1 = readNumber(&executionContext->Argument,&local_30);
  if (bVar1) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    CArbitraryInteger::GetTextValue(&local_30,&local_50);
    CNodeList<Refal2::CUnit>::Empty((CNodeList<Refal2::CUnit> *)executionContext);
    CUnitList::AppendText(&executionContext->Argument,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30);
  return bVar1;
}

Assistant:

static bool embeddedCvd( CExecutionContext& executionContext )
{
	DEBUG_PRINT( __FUNCTION__ )
	CArbitraryInteger number;
	if( !readNumber( executionContext.Argument, number ) ) {
		return false;
	}
	std::string text;
	number.GetTextValue( text );
	executionContext.Argument.Empty();
	executionContext.Argument.AppendText( text );
	return true;
}